

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::printDot(JSPrinter *this,Ref node)

{
  size_t sVar1;
  undefined8 *puVar2;
  Value *local_20;
  Ref node_local;
  
  local_20 = node.inst;
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  print(this,(Value *)*puVar2);
  maybeSpace(this,'.');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '.';
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  if (*(int *)*puVar2 == 0) {
    emit(this,*(char **)((int *)*puVar2 + 4));
    return;
  }
  __assert_fail("isString()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0xeb,"const char *cashew::Value::getCString()");
}

Assistant:

void printDot(Ref node) {
    print(node[1]);
    emit('.');
    emit(node[2]->getCString());
  }